

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::setup_shuffleColumn(HModel *this)

{
  long lVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  vector<int,_std::allocator<int>_> iFrom;
  vector<int,_std::allocator<int>_> start;
  vector<double,_std::allocator<double>_> du_ColUpperImplied;
  vector<double,_std::allocator<double>_> pr_ColUpperImplied;
  vector<double,_std::allocator<double>_> pr_ColLowerImplied;
  vector<double,_std::allocator<double>_> dxpert;
  vector<int,_std::allocator<int>_> ibreak;
  vector<double,_std::allocator<double>_> xcost;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  vector<double,_std::allocator<double>_> value;
  vector<int,_std::allocator<int>_> index;
  vector<double,_std::allocator<double>_> du_ColLowerImplied;
  vector<int,_std::allocator<int>_> local_1b8;
  pointer local_1a0;
  pointer local_198;
  pointer local_190;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  pointer local_170;
  pointer local_168;
  pointer local_160;
  pointer local_158;
  vector<int,_std::allocator<int>_> local_150;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->intOption[4] == 0) {
    return;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1b8,(long)this->numCol,(allocator_type *)&local_150);
  if (0 < this->numCol) {
    lVar13 = 0;
    do {
      local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13] = (int)lVar13;
      lVar13 = lVar13 + 1;
      iVar14 = this->numCol;
    } while (lVar13 < iVar14);
    if (1 < iVar14) {
      uVar15 = 0x4cdc141;
      uVar16 = 0x63932c3;
      uVar11 = (long)iVar14;
      do {
        uVar15 = (uVar15 >> 0x10) + (uVar15 & 0xffff) * 0x9069;
        uVar16 = (uVar16 >> 0x10) + (uVar16 & 0xffff) * 18000;
        uVar9 = (ulong)(uVar15 * 0x10000 + uVar16 >> 1) % (uVar11 & 0xffffffff);
        iVar14 = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11 - 1];
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11 - 1] =
             local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar9];
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = iVar14;
        bVar8 = 2 < uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar8);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_150,&this->Astart);
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&this->Aindex);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,&this->Avalue);
  std::vector<double,_std::allocator<double>_>::vector(&local_90,&this->colLower);
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,&this->colUpper);
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,&this->colCost);
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,&this->intBreak);
  std::vector<double,_std::allocator<double>_>::vector(&local_f0,&this->dblXpert);
  if (0 < this->numCol) {
    piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_158 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_160 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_168 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_170 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_178 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_188 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_198 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_1a0 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    pdVar4 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    iVar14 = 0;
    local_180 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_190 = local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    do {
      lVar10 = (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
      piVar3[lVar13] = iVar14;
      lVar12 = (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10];
      if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] <
          local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10 + 1]) {
        lVar17 = 0;
        do {
          local_160[iVar14 + lVar17] =
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12 + lVar17];
          local_170[iVar14 + lVar17] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12 + lVar17];
          lVar1 = lVar12 + lVar17;
          lVar17 = lVar17 + 1;
        } while (lVar1 + 1 <
                 (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10 + 1]);
        iVar14 = iVar14 + (int)lVar17;
      }
      local_178[lVar13] =
           local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10];
      local_188[lVar13] =
           local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10];
      local_198[lVar13] =
           local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10];
      local_1a0[lVar13] =
           local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar10];
      pdVar4[lVar13] =
           local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10];
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->numCol);
  }
  if (this->impliedBoundsPresolve == false) goto LAB_0012d57f;
  std::vector<double,_std::allocator<double>_>::vector(&local_108,&this->primalColLowerImplied);
  std::vector<double,_std::allocator<double>_>::vector(&local_120,&this->primalColUpperImplied);
  std::vector<double,_std::allocator<double>_>::vector(&local_138,&this->dualColUpperImplied);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&this->dualColLowerImplied);
  iVar14 = this->numCol;
  if ((long)iVar14 < 1) {
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) goto LAB_0012d53f;
  }
  else {
    pdVar4 = (this->primalColLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (this->primalColUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->dualColUpperImplied).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar7 = (this->dualColLowerImplied).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      iVar2 = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      pdVar4[lVar13] =
           local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2];
      pdVar5[lVar13] =
           local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2];
      pdVar6[lVar13] =
           local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2];
      pdVar7[lVar13] =
           local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2];
      lVar13 = lVar13 + 1;
    } while (iVar14 != lVar13);
LAB_0012d53f:
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0012d57f:
  mlFg_Update(this,this->mlFg_action_ShuffleLP);
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HModel::setup_shuffleColumn() {
    if (intOption[INTOPT_PERMUTE_FLAG] == 0)
        return;

    // 1. Shuffle the column index
    HRandom localRandom;
    for (int i = 0; i < 10; i++)
        localRandom.intRandom();
    vector<int> iFrom(numCol);
    for (int i = 0; i < numCol; i++)
        iFrom[i] = i;
    for (int i = numCol - 1; i >= 1; i--) {
        int j = localRandom.intRandom() % (i + 1);
        swap(iFrom[i], iFrom[j]);
    }

    // 2. Save original copy
    vector<int> start = Astart;
    vector<int> index = Aindex;
    vector<double> value = Avalue;
    vector<double> lower = colLower;
    vector<double> upper = colUpper;
    vector<double> xcost = colCost;
    vector<int> ibreak = intBreak;
    vector<double> dxpert = dblXpert;

    // 3. Generate the permuted matrix
    int countX = 0;
    for (int i = 0; i < numCol; i++) {
        int ifrom = iFrom[i];
        Astart[i] = countX;
        for (int k = start[ifrom]; k < start[ifrom + 1]; k++) {
            Aindex[countX] = index[k];
            Avalue[countX] = value[k];
            countX++;
        }
        colLower[i] = lower[ifrom];
        colUpper[i] = upper[ifrom];
        colCost[i] = xcost[ifrom];
        intBreak[i] = ibreak[ifrom];
        dblXpert[i] = dxpert[ifrom];
    }
	if (impliedBoundsPresolve) {
		vector<double> pr_ColLowerImplied = primalColLowerImplied;
		vector<double> pr_ColUpperImplied = primalColUpperImplied;
		vector<double> du_ColUpperImplied = dualColUpperImplied;
		vector<double> du_ColLowerImplied = dualColLowerImplied;
		for (int i = 0; i < numCol; i++) {
			int ifrom = iFrom[i];
			primalColLowerImplied[i] = pr_ColLowerImplied[ifrom];
			primalColUpperImplied[i] = pr_ColUpperImplied[ifrom];
			dualColUpperImplied[i] = du_ColUpperImplied[ifrom];
			dualColLowerImplied[i] = du_ColLowerImplied[ifrom];
		}
	}
    assert(Astart[numCol] == countX);
    //Deduce the consequences of shuffling the LP
    mlFg_Update(mlFg_action_ShuffleLP);
}